

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

intptr_t __thiscall Func::GetRuntimeInlineCache(Func *this,uint index)

{
  bool bVar1;
  intptr_t iVar2;
  JITTimeFunctionBody *this_00;
  
  if (this->m_runtimeInfo != (FunctionJITRuntimeInfo *)0x0) {
    bVar1 = FunctionJITRuntimeInfo::HasClonedInlineCaches(this->m_runtimeInfo);
    if (bVar1) {
      iVar2 = FunctionJITRuntimeInfo::GetClonedInlineCache(this->m_runtimeInfo,index);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
  }
  this_00 = GetJITFunctionBody(this);
  iVar2 = JITTimeFunctionBody::GetInlineCache(this_00,index);
  return iVar2;
}

Assistant:

intptr_t
Func::GetRuntimeInlineCache(const uint index) const
{
    if(m_runtimeInfo != nullptr && m_runtimeInfo->HasClonedInlineCaches())
    {
        intptr_t inlineCache = m_runtimeInfo->GetClonedInlineCache(index);
        if(inlineCache)
        {
            return inlineCache;
        }
    }

    return GetJITFunctionBody()->GetInlineCache(index);
}